

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O3

void __thiscall mocker::nasm::Module::Module(Module *this,Module *param_1)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>_>_>
  local_18;
  
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::vector(&this->directives,&param_1->directives);
  local_18._M_h = (__hashtable_alloc *)&this->sections;
  (this->sections)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->sections)._M_h._M_bucket_count = (param_1->sections)._M_h._M_bucket_count;
  (this->sections)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sections)._M_h._M_element_count = (param_1->sections)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(param_1->sections)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (param_1->sections)._M_h._M_rehash_policy._M_next_resize;
  (this->sections)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->sections)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->sections)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->sections)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->sections)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::nasm::Section>,std::allocator<std::pair<std::__cxx11::string_const,mocker::nasm::Section>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::nasm::Section>,std::allocator<std::pair<std::__cxx11::string_const,mocker::nasm::Section>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,mocker::nasm::Section>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::nasm::Section>,std::allocator<std::pair<std::__cxx11::string_const,mocker::nasm::Section>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_18._M_h,&(param_1->sections)._M_h,&local_18);
  return;
}

Assistant:

Module(const Module &) = default;